

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_c7dac::FromHising_MapINT_Test::TestBody(FromHising_MapINT_Test *this)

{
  char *message;
  BinaryPolynomialModel<int,_double> bpm;
  AssertHelper local_188;
  Message local_180;
  undefined1 local_178 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  BinaryPolynomialModel<int,_double> local_140;
  
  GeneratePolynomialINT();
  cimod::BinaryPolynomialModel<int,_double>::BinaryPolynomialModel
            (&local_140,(Polynomial<int,_double> *)local_178,SPIN);
  std::
  _Hashtable<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_178);
  local_180.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  local_188.data_._0_4_ = local_140.vartype_;
  testing::internal::CmpHelperEQ<cimod::Vartype,cimod::Vartype>
            ((internal *)local_178,"Vartype::SPIN","bpm.GetVartype()",(Vartype *)&local_180,
             (Vartype *)&local_188);
  if (local_178[0] == (internal)0x0) {
    testing::Message::Message(&local_180);
    if (local_170 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_170->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test.cpp",
               0x563,message);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((long *)CONCAT44(local_180.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_180.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_180.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_180.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_170,local_170);
  }
  StateTestBPMINT(&local_140);
  std::
  _Hashtable<std::vector<int,_std::allocator<int>_>,_std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_140.poly_key_inv_._M_h);
  if (local_140.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.poly_value_list_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.poly_value_list_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.poly_value_list_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_140.poly_key_list_);
  if (local_140.sorted_variables_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.sorted_variables_.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_140.sorted_variables_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_140.sorted_variables_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Hashtable<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_140.variables_to_integers_._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_140.each_variable_num_._M_h);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_140);
  return;
}

Assistant:

TEST(FromHising, MapINT) {
   auto bpm = BinaryPolynomialModel<int32_t, double>::FromHising(GeneratePolynomialINT());
   EXPECT_EQ(Vartype::SPIN, bpm.GetVartype());
   StateTestBPMINT(bpm);
}